

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

bool __thiscall
Catch::ConsoleReporter::assertionEnded(ConsoleReporter *this,AssertionStats *_assertionStats)

{
  string *this_00;
  OfType OVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  ostream *poVar5;
  char *pcVar6;
  pointer pMVar7;
  Colour colourGuard_3;
  Colour colourGuard;
  ConsoleAssertionPrinter printer;
  Colour colourGuard_1;
  
  iVar3 = (*((this->super_StreamingReporterBase).m_config)->_vptr_IConfig[5])();
  printer.printInfoMessages = true;
  if (((char)iVar3 == '\0') &&
     (((OVar1 = (_assertionStats->assertionResult).m_resultData.resultType,
       (OVar1 & FailureBit) == Ok ||
       (((_assertionStats->assertionResult).m_info.resultDisposition & SuppressFail) != 0)) &&
      (printer.printInfoMessages = false, OVar1 != Warning)))) {
    return false;
  }
  lazyPrint(this);
  printer.stream = (this->super_StreamingReporterBase).stream;
  this_00 = &printer.passOrFail;
  printer.colour = None;
  printer.passOrFail._M_dataplus._M_p = (pointer)&printer.passOrFail.field_2;
  printer.passOrFail._M_string_length = 0;
  printer.passOrFail.field_2._M_local_buf[0] = '\0';
  printer.messageLabel._M_dataplus._M_p = (pointer)&printer.messageLabel.field_2;
  printer.messageLabel._M_string_length = 0;
  printer.messageLabel.field_2._M_local_buf[0] = '\0';
  printer.stats = _assertionStats;
  printer.result = &_assertionStats->assertionResult;
  std::__cxx11::string::string
            ((string *)&printer.message,&(_assertionStats->assertionResult).m_resultData.message);
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::vector
            (&printer.messages,&_assertionStats->infoMessages);
  OVar1 = ((printer.result)->m_resultData).resultType;
  switch(OVar1) {
  case Ok:
    printer.colour = Green;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              (this_00,"PASSED");
    lVar4 = (long)(_assertionStats->infoMessages).
                  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(_assertionStats->infoMessages).
                  super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    if (lVar4 == 0x48) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                (&printer.messageLabel,"with message");
LAB_001468df:
      lVar4 = (long)(_assertionStats->infoMessages).
                    super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(_assertionStats->infoMessages).
                    super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                    _M_impl.super__Vector_impl_data._M_start;
    }
LAB_001468ed:
    if ((ulong)(lVar4 / 0x48) < 2) goto LAB_00146909;
    pcVar6 = "with messages";
    break;
  case Info:
    pcVar6 = "info";
    break;
  case Warning:
    pcVar6 = "warning";
    break;
  case Unknown:
    goto switchD_0014670f_caseD_ffffffff;
  default:
    if (OVar1 != FailureBit) {
      if (OVar1 == ExpressionFailed) {
        bVar2 = (((printer.result)->m_info).resultDisposition & SuppressFail) == 0;
        printer.colour = Green;
        if (bVar2) {
          printer.colour = BrightRed;
        }
        pcVar6 = "FAILED - but was ok";
        if (bVar2) {
          pcVar6 = "FAILED";
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                  (this_00,pcVar6);
        lVar4 = (long)(_assertionStats->infoMessages).
                      super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(_assertionStats->infoMessages).
                      super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                      _M_impl.super__Vector_impl_data._M_start;
        if (lVar4 == 0x48) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                    (&printer.messageLabel,"with message");
          goto LAB_001468df;
        }
        goto LAB_001468ed;
      }
      if (OVar1 == ExplicitFailure) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                  (this_00,"FAILED");
        printer.colour = BrightRed;
        lVar4 = (long)(_assertionStats->infoMessages).
                      super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(_assertionStats->infoMessages).
                      super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                      _M_impl.super__Vector_impl_data._M_start;
        if (lVar4 == 0x48) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                    (&printer.messageLabel,"explicitly with message");
          lVar4 = (long)(_assertionStats->infoMessages).
                        super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(_assertionStats->infoMessages).
                        super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                        _M_impl.super__Vector_impl_data._M_start;
        }
        if ((ulong)(lVar4 / 0x48) < 2) goto LAB_00146909;
        pcVar6 = "explicitly with messages";
      }
      else {
        if (OVar1 == Exception) goto switchD_0014670f_caseD_ffffffff;
        if (OVar1 == ThrewException) {
          printer.colour = BrightRed;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                    (this_00,"FAILED");
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                    (&printer.messageLabel,"due to unexpected exception with ");
          lVar4 = (long)(_assertionStats->infoMessages).
                        super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(_assertionStats->infoMessages).
                        super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
                        _M_impl.super__Vector_impl_data._M_start;
          if (lVar4 == 0x48) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&printer.messageLabel,"message");
            lVar4 = (long)(_assertionStats->infoMessages).
                          super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(_assertionStats->infoMessages).
                          super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start;
          }
          if (1 < (ulong)(lVar4 / 0x48)) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&printer.messageLabel,"messages");
          }
          goto LAB_00146909;
        }
        if (OVar1 == DidntThrowException) {
          printer.colour = BrightRed;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                    (this_00,"FAILED");
          pcVar6 = "because no exception was thrown where one was expected";
        }
        else {
          if (OVar1 != FatalErrorCondition) goto LAB_00146909;
          printer.colour = BrightRed;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                    (this_00,"FAILED");
          pcVar6 = "due to a fatal error condition";
        }
      }
      break;
    }
    goto switchD_0014670f_caseD_ffffffff;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (&printer.messageLabel,pcVar6);
LAB_00146909:
  colourGuard.m_moved = false;
  Colour::use(FileName);
  poVar5 = printer.stream;
  _colourGuard_1 = ((printer.result)->m_info).lineInfo.file;
  Catch::operator<<(printer.stream,(SourceLineInfo *)&colourGuard_1);
  std::operator<<(poVar5,": ");
  Colour::~Colour(&colourGuard);
  if (((printer.stats)->totals).assertions.failed + ((printer.stats)->totals).assertions.passed +
      ((printer.stats)->totals).assertions.failedButOk == 0) {
    std::operator<<(printer.stream,'\n');
  }
  else {
    if (printer.passOrFail._M_string_length != 0) {
      _colourGuard_1 = _colourGuard_1 & 0xffffffffffffff00;
      Colour::use(printer.colour);
      poVar5 = std::operator<<(printer.stream,(string *)this_00);
      std::operator<<(poVar5,":\n");
      Colour::~Colour(&colourGuard_1);
    }
    if (((printer.result)->m_info).capturedExpression.m_size != 0) {
      colourGuard.m_moved = false;
      Colour::use(Cyan);
      std::operator<<(printer.stream,"  ");
      poVar5 = printer.stream;
      AssertionResult::getExpressionInMacro_abi_cxx11_((string *)&colourGuard_1,printer.result);
      std::operator<<(poVar5,(string *)&colourGuard_1);
      std::__cxx11::string::~string((string *)&colourGuard_1);
      std::operator<<(printer.stream,'\n');
      Colour::~Colour(&colourGuard);
    }
    bVar2 = AssertionResult::hasExpandedExpression(printer.result);
    if (bVar2) {
      std::operator<<(printer.stream,"with expansion:\n");
      colourGuard_3.m_moved = false;
      Colour::use(BrightYellow);
      poVar5 = printer.stream;
      AssertionResult::getExpandedExpression_abi_cxx11_((string *)&colourGuard,printer.result);
      TextFlow::Column::Column((Column *)&colourGuard_1,(string *)&colourGuard);
      TextFlow::operator<<(poVar5,(Column *)&colourGuard_1);
      std::operator<<(poVar5,'\n');
      std::__cxx11::string::~string((string *)&colourGuard_1);
      std::__cxx11::string::~string((string *)&colourGuard);
      Colour::~Colour(&colourGuard_3);
    }
  }
  if (printer.messageLabel._M_string_length != 0) {
    poVar5 = std::operator<<(printer.stream,(string *)&printer.messageLabel);
    poVar5 = std::operator<<(poVar5,':');
    std::operator<<(poVar5,'\n');
  }
  for (pMVar7 = printer.messages.
                super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
                super__Vector_impl_data._M_start; poVar5 = printer.stream,
      pMVar7 != printer.messages.
                super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
                super__Vector_impl_data._M_finish; pMVar7 = pMVar7 + 1) {
    if ((printer.printInfoMessages != false) || (pMVar7->type != Info)) {
      TextFlow::Column::Column((Column *)&colourGuard_1,&pMVar7->message);
      TextFlow::operator<<(poVar5,(Column *)&colourGuard_1);
      std::operator<<(poVar5,'\n');
      std::__cxx11::string::~string((string *)&colourGuard_1);
    }
  }
  std::endl<char,std::char_traits<char>>((this->super_StreamingReporterBase).stream);
  anon_unknown_23::ConsoleAssertionPrinter::~ConsoleAssertionPrinter(&printer);
  return true;
switchD_0014670f_caseD_ffffffff:
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (this_00,"** internal error **");
  printer.colour = BrightRed;
  goto LAB_00146909;
}

Assistant:

bool ConsoleReporter::assertionEnded(AssertionStats const &_assertionStats) {
                AssertionResult const &result = _assertionStats.assertionResult;

                bool includeResults = m_config->includeSuccessfulResults() || !result.isOk();

                // Drop out if result was successful but we're not printing them.
                if (!includeResults && result.getResultType() != ResultWas::Warning)
                    return false;

                lazyPrint();

                ConsoleAssertionPrinter printer(stream, _assertionStats, includeResults);
                printer.print();
                stream << std::endl;
                return true;
            }